

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
InnerMap::clear(InnerMap *this)

{
  Node *pNVar1;
  LogMessage *other;
  void **ppvVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  ulong uVar4;
  Node *node;
  LogFinisher local_71;
  ulong local_70;
  LogMessage local_68;
  
  for (uVar4 = 0; uVar4 < this->num_buckets_; uVar4 = uVar4 + 1) {
    ppvVar2 = this->table_;
    node = (Node *)ppvVar2[uVar4];
    if (node != (Node *)0x0) {
      if (node == (Node *)ppvVar2[uVar4 ^ 1]) {
        if (((uVar4 & 1) != 0) || (node != (Node *)ppvVar2[uVar4 + 1])) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                     ,0x1fe);
          other = internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ")
          ;
          internal::LogFinisher::operator=(&local_71,other);
          internal::LogMessage::~LogMessage(&local_68);
          ppvVar2 = this->table_;
        }
        ppvVar2[uVar4 + 1] = (void *)0x0;
        this->table_[uVar4] = (void *)0x0;
        local_70 = uVar4 + 1;
        __position._M_node = (_Base_ptr)(node->kv).v_;
        do {
          pNVar1 = *(Node **)(__position._M_node + 1);
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<std::__cxx11::string*,std::__cxx11::string*,std::_Identity<std::__cxx11::string*>,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string*,std::__cxx11::string*,std::_Identity<std::__cxx11::string*>,google::protobuf::Map<std::__cxx11::string,double>::InnerMap::KeyCompare,google::protobuf::Map<std::__cxx11::string,double>::MapAllocator<std::__cxx11::string*>>
                              *)node,__position);
          DestroyNode(this,pNVar1);
          __position._M_node = p_Var3;
        } while (p_Var3 != (_Base_ptr)&(node->kv).k_.field_2);
        DestroyTree(this,(Tree *)node);
        uVar4 = local_70;
      }
      else {
        ppvVar2[uVar4] = (void *)0x0;
        do {
          pNVar1 = node->next;
          DestroyNode(this,node);
          node = pNVar1;
        } while (pNVar1 != (Node *)0x0);
      }
    }
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = this->num_buckets_;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = NULL;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != NULL);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = NULL;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodePtrFromKeyPtr(*tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }